

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptFunction.cpp
# Opt level: O3

bool __thiscall
Js::JavascriptFunction::GetSetterBuiltIns
          (JavascriptFunction *this,PropertyId propertyId,Var *setterValue,PropertyValueInfo *info,
          ScriptContext *requestContext,DescriptorFlags *descriptorFlags)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  JavascriptMethod p_Var4;
  DescriptorFlags DVar5;
  
  if (propertyId == -1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptFunction.cpp"
                                ,0xa1d,"(propertyId != Constants::NoProperty)",
                                "propertyId != Constants::NoProperty");
    if (!bVar2) goto LAB_00bc88ad;
    *puVar3 = 0;
  }
  if (setterValue == (Var *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptFunction.cpp"
                                ,0xa1e,"(setterValue)","setterValue");
    if (!bVar2) goto LAB_00bc88ad;
    *puVar3 = 0;
  }
  if (requestContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptFunction.cpp"
                                ,0xa1f,"(requestContext)","requestContext");
    if (!bVar2) {
LAB_00bc88ad:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  if (((propertyId | 2U) == 0x1cf) && (bVar2 = HasRestrictedProperties(this), bVar2)) {
    if (info != (PropertyValueInfo *)0x0) {
      info->m_instance = (RecyclableObject *)this;
      info->m_propertyIndex = 0xffff;
      info->m_attributes = '\0';
      info->flags = InlineCacheNoFlags;
    }
    p_Var4 = RecyclableObject::GetEntryPoint((RecyclableObject *)this);
    DVar5 = Data;
    if (p_Var4 == PrototypeEntryPoint) {
      *setterValue = (((requestContext->super_ScriptContextBase).javascriptLibrary)->
                     super_JavascriptLibraryBase).throwTypeErrorRestrictedPropertyAccessorFunction.
                     ptr;
      DVar5 = Accessor;
    }
    *descriptorFlags = DVar5;
    return true;
  }
  return false;
}

Assistant:

bool JavascriptFunction::GetSetterBuiltIns(PropertyId propertyId, Var *setterValue, PropertyValueInfo* info, ScriptContext* requestContext, DescriptorFlags* descriptorFlags)
    {
        Assert(propertyId != Constants::NoProperty);
        Assert(setterValue);
        Assert(requestContext);

        switch (propertyId)
        {
        case PropertyIds::caller:
        case PropertyIds::arguments:
            if (this->HasRestrictedProperties()) {
                PropertyValueInfo::SetNoCache(info, this);
                if (this->GetEntryPoint() == JavascriptFunction::PrototypeEntryPoint)
                {
                    *setterValue = requestContext->GetLibrary()->GetThrowTypeErrorRestrictedPropertyAccessorFunction();
                    *descriptorFlags = Accessor;
                }
                else
                {
                    *descriptorFlags = Data;
                }
                return true;
            }
            break;
        }

        return false;
    }